

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

void Pdr_ManDumpClauses(Pdr_Man_t *p,char *pFileName,int fProved)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  Abc_Frame_t *p_00;
  Abc_Ntk_t *pNtk;
  char **__ptr;
  Pdr_Set_t *p_01;
  uint local_7c;
  Vec_Ptr_t *local_68;
  uint local_54;
  int Count;
  int kStart;
  int i;
  char **pNamesCi;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *vFlopCounts;
  FILE *pFile;
  int fUseSupp;
  int fProved_local;
  char *pFileName_local;
  Pdr_Man_t *p_local;
  
  pFile._0_4_ = 1;
  pFile._4_4_ = fProved;
  _fUseSupp = pFileName;
  pFileName_local = (char *)p;
  vFlopCounts = (Vec_Int_t *)fopen(pFileName,"w");
  if ((FILE *)vFlopCounts == (FILE *)0x0) {
    Abc_Print(1,"Cannot open file \"%s\" for writing invariant.\n",_fUseSupp);
  }
  else {
    iVar2 = Pdr_ManFindInvariantStart((Pdr_Man_t *)pFileName_local);
    if (pFile._4_4_ == 0) {
      pCube = (Pdr_Set_t *)Vec_PtrDup(*(Vec_Ptr_t **)(pFileName_local + 0x100));
    }
    else {
      pCube = (Pdr_Set_t *)Pdr_ManCollectCubes((Pdr_Man_t *)pFileName_local,iVar2);
    }
    Vec_PtrSort((Vec_Ptr_t *)pCube,Pdr_SetCompare);
    local_54 = 0;
    for (Count = 0; iVar3 = Vec_PtrSize((Vec_Ptr_t *)pCube), Count < iVar3; Count = Count + 1) {
      pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)pCube,Count);
      if (*(int *)((long)pvVar4 + 8) != -1) {
        local_54 = local_54 + 1;
      }
    }
    if ((int)pFile == 0) {
      local_68 = (Vec_Ptr_t *)0x0;
    }
    else {
      local_68 = (Vec_Ptr_t *)Pdr_ManCountFlops((Pdr_Man_t *)pFileName_local,(Vec_Ptr_t *)pCube);
    }
    vCubes = local_68;
    if (pFile._4_4_ == 0) {
      fprintf((FILE *)vFlopCounts,"# Clauses of the last timeframe for \"%s\"\n",
              **(undefined8 **)(pFileName_local + 8));
    }
    else {
      fprintf((FILE *)vFlopCounts,"# Inductive invariant for \"%s\"\n",
              **(undefined8 **)(pFileName_local + 8));
    }
    pVVar1 = vFlopCounts;
    pcVar5 = Aig_TimeStamp();
    fprintf((FILE *)pVVar1,"# generated by PDR in ABC on %s\n",pcVar5);
    pVVar1 = vFlopCounts;
    if ((int)pFile == 0) {
      local_7c = Aig_ManRegNum(*(Aig_Man_t **)(pFileName_local + 8));
    }
    else {
      local_7c = Pdr_ManCountVariables((Pdr_Man_t *)pFileName_local,iVar2);
    }
    fprintf((FILE *)pVVar1,".i %d\n",(ulong)local_7c);
    fprintf((FILE *)vFlopCounts,".o 1\n");
    fprintf((FILE *)vFlopCounts,".p %d\n",(ulong)local_54);
    p_00 = Abc_FrameReadGlobalFrame();
    pNtk = Abc_FrameReadNtk(p_00);
    __ptr = Abc_NtkCollectCioNames(pNtk,0);
    if (__ptr != (char **)0x0) {
      fprintf((FILE *)vFlopCounts,".ilb");
      for (Count = 0; iVar2 = Aig_ManRegNum(*(Aig_Man_t **)(pFileName_local + 8)), Count < iVar2;
          Count = Count + 1) {
        if (((int)pFile == 0) || (iVar2 = Vec_IntEntry((Vec_Int_t *)vCubes,Count), iVar2 != 0)) {
          pVVar1 = vFlopCounts;
          iVar2 = Saig_ManPiNum(*(Aig_Man_t **)(pFileName_local + 8));
          fprintf((FILE *)pVVar1," %s",__ptr[iVar2 + Count]);
        }
      }
      fprintf((FILE *)vFlopCounts,"\n");
      if (__ptr != (char **)0x0) {
        free(__ptr);
      }
      fprintf((FILE *)vFlopCounts,".ob inv\n");
    }
    for (Count = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pCube), Count < iVar2; Count = Count + 1) {
      p_01 = (Pdr_Set_t *)Vec_PtrEntry((Vec_Ptr_t *)pCube,Count);
      pVVar1 = vFlopCounts;
      if (p_01->nRefs != -1) {
        iVar2 = Aig_ManRegNum(*(Aig_Man_t **)(pFileName_local + 8));
        Pdr_SetPrint((FILE *)pVVar1,p_01,iVar2,(Vec_Int_t *)vCubes);
        fprintf((FILE *)vFlopCounts," 1\n");
      }
    }
    fprintf((FILE *)vFlopCounts,".e\n\n");
    fclose((FILE *)vFlopCounts);
    Vec_IntFreeP((Vec_Int_t **)&vCubes);
    Vec_PtrFree((Vec_Ptr_t *)pCube);
    if (pFile._4_4_ == 0) {
      Abc_Print(1,"Clauses of the last timeframe were written into file \"%s\".\n",_fUseSupp);
    }
    else {
      Abc_Print(1,"Inductive invariant was written into file \"%s\".\n",_fUseSupp);
    }
  }
  return;
}

Assistant:

void Pdr_ManDumpClauses( Pdr_Man_t * p, char * pFileName, int fProved )
{
    int fUseSupp = 1;
    FILE * pFile;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    char ** pNamesCi;
    int i, kStart, Count = 0;
    // create file
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file \"%s\" for writing invariant.\n", pFileName );
        return;
    } 
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( fProved )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
//    Pdr_ManDumpAig( p->pAig, vCubes );
    // count cubes
    Count = 0;
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Count++;
    }
    // collect variable appearances
    vFlopCounts = fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output the header
    if ( fProved )
        fprintf( pFile, "# Inductive invariant for \"%s\"\n", p->pAig->pName );
    else
        fprintf( pFile, "# Clauses of the last timeframe for \"%s\"\n", p->pAig->pName );
    fprintf( pFile, "# generated by PDR in ABC on %s\n", Aig_TimeStamp() );
    fprintf( pFile, ".i %d\n", fUseSupp ? Pdr_ManCountVariables(p, kStart) : Aig_ManRegNum(p->pAig) );
    fprintf( pFile, ".o 1\n" );
    fprintf( pFile, ".p %d\n", Count );
    // output flop names
    pNamesCi = Abc_NtkCollectCioNames( Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() ), 0 );
    if ( pNamesCi )
    {
        fprintf( pFile, ".ilb" );
        for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
            if ( !fUseSupp || Vec_IntEntry( vFlopCounts, i ) )
                fprintf( pFile, " %s", pNamesCi[Saig_ManPiNum(p->pAig) + i] );
        fprintf( pFile, "\n" );
        ABC_FREE( pNamesCi );
        fprintf( pFile, ".ob inv\n" );
    }
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrint( pFile, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
        fprintf( pFile, " 1\n" ); 
    }
    fprintf( pFile, ".e\n\n" );
    fclose( pFile );
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    if ( fProved )
        Abc_Print( 1, "Inductive invariant was written into file \"%s\".\n", pFileName );
    else
        Abc_Print( 1, "Clauses of the last timeframe were written into file \"%s\".\n", pFileName );
}